

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::api::anon_unknown_0::ImageClearingTestInstance::verifyResultImage
          (TestStatus *__return_storage_ptr__,ImageClearingTestInstance *this,string *successMessage
          ,UVec4 *clearCoords)

{
  TextureFormat *pTVar1;
  undefined4 uVar2;
  ConstPixelBufferAccess *this_00;
  pointer pcVar3;
  undefined4 uVar5;
  pointer pPVar4;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  ios_base *piVar11;
  int ndx;
  TextureChannelClass TVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  TextureFormat TVar16;
  ostream *poVar17;
  TestParams_conflict *pTVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  byte bVar22;
  uint uVar23;
  TextureFormat *pTVar24;
  uint uVar25;
  bool bVar26;
  bool bVar27;
  uint uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  BVec4 channelMask;
  float floatThreshold;
  MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> image;
  Vector<bool,_4> res_2;
  string message;
  Vec4 threshold;
  TextureFormat format;
  Vec4 refColor;
  Vector<bool,_4> res_1;
  TextureFormat format_1;
  MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> image_2;
  stringstream s;
  uint local_2e0;
  Vector<bool,_4> local_2dc;
  int local_2d8;
  float local_2d4;
  ios_base *local_2d0;
  undefined1 local_2c8 [24];
  ImageClearingTestInstance *local_2b0;
  int local_2a8 [4];
  long local_298 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  float local_254;
  undefined1 local_250 [16];
  TestStatus *local_240;
  TextureFormat local_238;
  TextureFormat TStack_230;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  TextureFormat local_218;
  int local_210;
  uint local_20c;
  ulong local_208;
  string *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  string *local_1f0;
  ulong local_1e8;
  long local_1e0;
  ulong local_1d8;
  long local_1d0;
  UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> local_1c8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  local_1b8 = (undefined1  [16])0x0;
  bVar26 = true;
  if (clearCoords->m_data[0] == 0) {
    uVar15 = 0xffffffffffffffff;
    do {
      if (uVar15 == 2) {
        uVar20 = 3;
        break;
      }
      lVar10 = uVar15 + 2;
      uVar20 = uVar15 + 1;
      lVar21 = uVar15 * 4;
      uVar15 = uVar20;
    } while (clearCoords->m_data[lVar10] == *(uint *)(local_1b8 + lVar21 + 8));
    bVar26 = uVar20 < 3;
  }
  local_2c8._16_8_ = clearCoords;
  local_240 = __return_storage_ptr__;
  local_200 = successMessage;
  TVar16 = ::vk::mapVkFormat(this->m_params->imageFormat);
  local_2b0 = this;
  if ((TVar16.order == DS) || (TVar16.order == D)) {
    readImage((MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> *)
              local_2c8,this,2);
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    local_288._M_string_length = 0;
    local_288.field_2._M_local_buf[0] = '\0';
    bVar27 = (this->m_params->imageExtent).height != 0;
    if (bVar27) {
      uVar25 = 0;
      do {
        pTVar18 = this->m_params;
        if ((pTVar18->imageExtent).width != 0) {
          uVar23 = 0;
          do {
            lVar21 = 0x28;
            if (bVar26) {
              if ((*(uint *)local_2c8._16_8_ <= uVar23 || ((uint *)local_2c8._16_8_)[1] <= uVar25)
                 && (*(uint *)local_2c8._16_8_ <= uVar23 || uVar25 < ((uint *)local_2c8._16_8_)[3]))
              {
                if ((uVar23 < ((uint *)local_2c8._16_8_)[2]) ||
                   (((uint *)local_2c8._16_8_)[1] <= uVar25 &&
                    uVar25 < ((uint *)local_2c8._16_8_)[3])) goto LAB_0048668f;
              }
              lVar21 = 0x18;
            }
LAB_0048668f:
            local_2d0 = (ios_base *)
                        CONCAT44(local_2d0._4_4_,
                                 *(undefined4 *)((long)pTVar18->clearValue + lVar21 + -0x28));
            this_00 = *(ConstPixelBufferAccess **)(CONCAT44(local_2c8._4_4_,local_2c8._0_4_) + 0x20)
            ;
            local_250._0_8_ =
                 tcu::getEffectiveDepthStencilTextureFormat(&this_00->m_format,MODE_DEPTH);
            TVar12 = tcu::getTextureChannelClass(local_250._4_4_);
            if (TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT < TVar12) {
              if (TVar12 == TEXTURECHANNELCLASS_FLOATING_POINT) {
                local_2d4 = tcu::ConstPixelBufferAccess::getPixDepth(this_00,uVar23,uVar25,0);
                tcu::getTextureFormatMantissaBitDepth((tcu *)local_1b8,(TextureFormat *)local_250);
                fVar29 = ABS(local_2d4);
                fVar30 = ABS(local_2d0._0_4_);
                iVar14 = (int)fVar29 - (int)fVar30;
                if ((uint)fVar29 < (uint)fVar30) {
                  iVar14 = -((int)fVar29 - (int)fVar30);
                }
                fVar29 = (float)(10 << (0x17U - (char)local_1b8[0] & 0x1f));
                bVar6 = iVar14 <= (int)fVar29;
                if ((int)fVar29 < iVar14) {
                  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8[0]._M_local_buf,"Ref:",4);
                  poVar17 = std::ostream::_M_insert<double>((double)local_2d0._0_4_);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Threshold:",0xb);
                  poVar17 = std::ostream::_M_insert<double>((double)fVar29);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Depth:",7);
                  std::ostream::_M_insert<double>((double)local_2d4);
                  std::__cxx11::stringbuf::str();
                  goto LAB_00486952;
                }
                goto LAB_004867a5;
              }
LAB_0048699f:
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1b8,"Depth value mismatch! ",&local_288);
              local_240->m_code = QP_TEST_RESULT_FAIL;
              (local_240->m_description)._M_dataplus._M_p =
                   (pointer)&(local_240->m_description).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_240->m_description,local_1b8._0_8_,
                         (pointer)(local_1b8._0_8_ + local_1b8._8_8_));
              this = local_2b0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8._0_8_ != local_1a8) {
                operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_288._M_dataplus._M_p != &local_288.field_2) {
                operator_delete(local_288._M_dataplus._M_p,
                                CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                         local_288.field_2._M_local_buf[0]) + 1);
              }
              de::details::
              UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>::
              reset((UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                     *)local_2c8);
              if (bVar27) {
                return local_240;
              }
              goto LAB_00486a43;
            }
            tcu::getTextureFormatBitDepth((tcu *)local_1b8,(TextureFormat *)local_250);
            auVar9 = local_1b8;
            fVar29 = tcu::ConstPixelBufferAccess::getPixDepth(this_00,uVar23,uVar25,0);
            fVar31 = 2.0 / (float)~(-1 << (auVar9[0] & 0x1f));
            fVar30 = fVar29 - local_2d0._0_4_;
            uVar28 = -(uint)(-fVar30 <= fVar30);
            bVar6 = (float)(~uVar28 & (uint)-fVar30 | (uint)fVar30 & uVar28) <= fVar31;
            if (!bVar6) {
              local_2d4 = fVar31;
              local_254 = fVar29;
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8[0]._M_local_buf,"Ref:",4);
              poVar17 = std::ostream::_M_insert<double>((double)local_2d0._0_4_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17," Threshold:",0xb);
              poVar17 = std::ostream::_M_insert<double>((double)local_2d4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17," Depth:",7);
              std::ostream::_M_insert<double>((double)local_254);
              std::__cxx11::stringbuf::str();
LAB_00486952:
              std::__cxx11::string::operator=((string *)&local_288,(string *)local_2a8);
              if ((long *)CONCAT44(local_2a8[1],local_2a8[0]) != local_298) {
                operator_delete((long *)CONCAT44(local_2a8[1],local_2a8[0]),local_298[0] + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
              std::ios_base::~ios_base(local_138);
              goto LAB_0048699f;
            }
LAB_004867a5:
            if (!bVar6) goto LAB_0048699f;
            uVar23 = uVar23 + 1;
            pTVar18 = local_2b0->m_params;
          } while (uVar23 < (pTVar18->imageExtent).width);
        }
        uVar25 = uVar25 + 1;
        bVar27 = uVar25 < (local_2b0->m_params->imageExtent).height;
        this = local_2b0;
      } while (bVar27);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,
                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                               local_288.field_2._M_local_buf[0]) + 1);
    }
    de::details::UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
    ::reset((UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> *)
            local_2c8);
  }
LAB_00486a43:
  TVar16 = ::vk::mapVkFormat(this->m_params->imageFormat);
  if (TVar16.order - S < 2) {
    readImage((MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> *)
              local_2c8,this,4);
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    local_288._M_string_length = 0;
    local_288.field_2._M_local_buf[0] = '\0';
    bVar27 = (this->m_params->imageExtent).height != 0;
    if (bVar27) {
      uVar25 = 0;
      do {
        local_2d0 = (ios_base *)CONCAT71(local_2d0._1_7_,bVar27);
        pTVar18 = this->m_params;
        if ((pTVar18->imageExtent).width != 0) {
          uVar23 = 0;
          do {
            lVar21 = 0x2c;
            if (bVar26) {
              if ((*(uint *)local_2c8._16_8_ <= uVar23 || ((uint *)local_2c8._16_8_)[1] <= uVar25)
                 && (*(uint *)local_2c8._16_8_ <= uVar23 || uVar25 < ((uint *)local_2c8._16_8_)[3]))
              {
                if ((uVar23 < ((uint *)local_2c8._16_8_)[2]) ||
                   (((uint *)local_2c8._16_8_)[1] <= uVar25 &&
                    uVar25 < ((uint *)local_2c8._16_8_)[3])) goto LAB_00486b0f;
              }
              lVar21 = 0x1c;
            }
LAB_00486b0f:
            iVar14 = *(int *)((long)pTVar18->clearValue + lVar21 + -0x28);
            iVar13 = tcu::ConstPixelBufferAccess::getPixStencil
                               (*(ConstPixelBufferAccess **)
                                 (CONCAT44(local_2c8._4_4_,local_2c8._0_4_) + 0x20),uVar23,uVar25,0)
            ;
            if (iVar13 != iVar14) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8[0]._M_local_buf,"Ref:",4);
              poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17," Threshold:0",0xc);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17," Stencil:",9);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::operator=((string *)&local_288,(string *)local_2a8);
              if ((long *)CONCAT44(local_2a8[1],local_2a8[0]) != local_298) {
                operator_delete((long *)CONCAT44(local_2a8[1],local_2a8[0]),local_298[0] + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
              std::ios_base::~ios_base(local_138);
              if (iVar13 != iVar14) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1b8,"Stencil value mismatch! ",&local_288);
                local_240->m_code = QP_TEST_RESULT_FAIL;
                (local_240->m_description)._M_dataplus._M_p =
                     (pointer)&(local_240->m_description).field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_240->m_description,local_1b8._0_8_,
                           (pointer)(local_1b8._0_8_ + local_1b8._8_8_));
                this = local_2b0;
                piVar11 = local_2d0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8._0_8_ != local_1a8) {
                  operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_288._M_dataplus._M_p != &local_288.field_2) {
                  operator_delete(local_288._M_dataplus._M_p,
                                  CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                           local_288.field_2._M_local_buf[0]) + 1);
                }
                de::details::
                UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                ::reset((UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
                         *)local_2c8);
                if (((ulong)piVar11 & 1) != 0) {
                  return local_240;
                }
                goto LAB_00486cfd;
              }
            }
            uVar23 = uVar23 + 1;
            pTVar18 = local_2b0->m_params;
          } while (uVar23 < (pTVar18->imageExtent).width);
        }
        uVar25 = uVar25 + 1;
        bVar27 = uVar25 < (local_2b0->m_params->imageExtent).height;
        this = local_2b0;
      } while (bVar27);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,
                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                               local_288.field_2._M_local_buf[0]) + 1);
    }
    de::details::UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
    ::reset((UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> *)
            local_2c8);
    this = local_2b0;
  }
LAB_00486cfd:
  bVar27 = ::vk::isDepthStencilFormat(this->m_params->imageFormat);
  if (!bVar27) {
    readImage((MovePtr<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_> *)
              &local_1c8,this,1);
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    local_288._M_string_length = 0;
    local_288.field_2._M_local_buf[0] = '\0';
    if (this->m_imageMipLevels != 0) {
      local_2d0 = local_138;
      local_1f0 = (string *)&local_240->m_description;
      local_1f8 = &(local_240->m_description).field_2;
      uVar15 = 0;
      do {
        pTVar18 = this->m_params;
        uVar2 = (pTVar18->imageExtent).width;
        uVar5 = (pTVar18->imageExtent).height;
        bVar22 = (byte)uVar15;
        local_20c = (uint)uVar2 >> (bVar22 & 0x1f);
        local_1d8 = (ulong)local_20c;
        local_20c = local_20c + (local_20c == 0);
        uVar25 = (uint)uVar5 >> (bVar22 & 0x1f);
        local_1e8 = (ulong)(uVar25 + (uVar25 == 0));
        uVar25 = (pTVar18->imageExtent).depth >> (bVar22 & 0x1f);
        local_210 = uVar25 + (uVar25 == 0);
        local_1d0 = (long)(int)(uint)uVar15;
        local_1e0 = (ulong)(this->m_thresholdMipLevel <= (uint)uVar15) << 4;
        local_2d8 = 0;
        local_208 = uVar15;
        do {
          local_2e0 = 0;
          do {
            bVar22 = true;
            uVar25 = 0;
            do {
              lVar21 = local_1d0;
              local_254 = (float)CONCAT31(local_254._1_3_,bVar22);
              if (bVar26) {
                if ((*(uint *)local_2c8._16_8_ <= uVar25 ||
                     ((uint *)local_2c8._16_8_)[1] <= local_2e0) &&
                   (*(uint *)local_2c8._16_8_ <= uVar25 || local_2e0 < ((uint *)local_2c8._16_8_)[3]
                   )) {
                  if ((uVar25 < ((uint *)local_2c8._16_8_)[2]) ||
                     (((uint *)local_2c8._16_8_)[1] <= local_2e0 &&
                      local_2e0 < ((uint *)local_2c8._16_8_)[3])) goto LAB_00486eb8;
                }
                pTVar24 = (TextureFormat *)&this->m_params->initValue;
              }
              else {
LAB_00486eb8:
                pTVar24 = (TextureFormat *)((long)this->m_params->clearValue + local_1e0);
              }
              pPVar4 = ((local_1c8.m_data.ptr)->m_access).
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_218 = *(TextureFormat *)(pPVar4 + local_1d0);
              TVar12 = tcu::getTextureChannelClass(local_218.type);
              tcu::getTextureFormatChannelMask((tcu *)&local_2dc,&local_218);
              if (TEXTURECHANNELCLASS_FLOATING_POINT < TVar12) {
LAB_0048784c:
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1b8,"Color value mismatch! ",&local_288);
                this = local_2b0;
                local_240->m_code = QP_TEST_RESULT_FAIL;
                (local_240->m_description)._M_dataplus._M_p = (pointer)local_1f8;
                std::__cxx11::string::_M_construct<char*>
                          (local_1f0,local_1b8._0_8_,(pointer)(local_1b8._0_8_ + local_1b8._8_8_));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8._0_8_ != local_1a8) {
                  operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
                }
                iVar13 = 1;
                iVar14 = (int)local_208;
                bVar22 = local_254._0_1_;
                goto LAB_004878dd;
              }
              pTVar1 = (TextureFormat *)(pPVar4 + lVar21);
              iVar14 = (int)pTVar1;
              switch(TVar12) {
              default:
                tcu::getTextureFormatBitDepth((tcu *)local_2c8,&local_218);
                tcu::ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)local_250,iVar14,uVar25,local_2e0);
                local_238 = *pTVar24;
                TStack_230 = pTVar24[1];
                bVar27 = TVar12 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
                local_268._0_4_ = 1.0;
                if (0 < (int)local_2c8._0_4_) {
                  local_268._0_4_ =
                       1.0 / ((float)(1 << ((char)local_2c8._0_4_ - bVar27 & 0x1fU)) + -1.0);
                }
                local_268._4_4_ = 1.0;
                if (0 < (int)local_2c8._4_4_) {
                  local_268._4_4_ =
                       1.0 / ((float)(1 << ((char)local_2c8._4_4_ - bVar27 & 0x1fU)) + -1.0);
                }
                fStack_260 = 1.0;
                if (0 < (int)local_2c8._8_4_) {
                  fStack_260 = 1.0 / ((float)(1 << ((char)local_2c8._8_4_ - bVar27 & 0x1fU)) + -1.0)
                  ;
                }
                fStack_25c = 1.0;
                if (0 < (int)local_2c8._12_4_) {
                  fStack_25c = 1.0 / ((float)(1 << ((char)local_2c8._12_4_ - bVar27 & 0x1fU)) + -1.0
                                     );
                }
                bVar27 = tcu::isSRGB(*pTVar1);
                if (bVar27) {
                  tcu::linearToSRGB((tcu *)local_1b8,(Vec4 *)&local_238);
                  local_238.order = local_1b8._0_4_;
                  local_238.type = local_1b8._4_4_;
                  TStack_230.order = local_1b8._8_4_;
                  TStack_230.type = local_1b8._12_4_;
                }
                local_1b8 = ZEXT816(0);
                lVar21 = 0;
                do {
                  fVar29 = *(float *)(local_250 + lVar21 * 4);
                  fVar30 = (float)(&local_238.order)[lVar21];
                  *(uint *)(local_1b8 + lVar21 * 4) =
                       ~-(uint)(fVar30 < fVar29) & (uint)(fVar30 - fVar29) |
                       (uint)(fVar29 - fVar30) & -(uint)(fVar30 < fVar29);
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 4);
                auVar7._12_4_ = 0;
                auVar7._0_12_ = stack0xfffffffffffffddc;
                _local_228 = (float  [4])(auVar7 << 0x20);
                lVar21 = 0;
                do {
                  local_228[lVar21] =
                       *(float *)(local_1b8 + lVar21 * 4) <= *(float *)(local_268 + lVar21 * 4);
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 4);
                local_2a8[0] = 0;
                lVar21 = 0;
                do {
                  *(char *)((long)local_2a8 + lVar21) = local_2dc.m_data[lVar21] & local_228[lVar21]
                  ;
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 4);
                lVar21 = 0;
                bVar27 = false;
                do {
                  bVar6 = !bVar27;
                  bVar27 = true;
                  if (bVar6) {
                    bVar27 = (bool)*(char *)((long)local_2a8 + lVar21) != local_2dc.m_data[lVar21];
                  }
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 4);
                bVar27 = (bool)(bVar27 ^ 1);
                if (!bVar27) {
                  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8[0]._M_local_buf,"Ref:",4);
                  poVar17 = tcu::operator<<((ostream *)local_1a8[0]._M_local_buf,
                                            (Vector<float,_4> *)&local_238);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Mask:",6);
                  poVar17 = tcu::operator<<(poVar17,&local_2dc);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Threshold:",0xb);
                  poVar17 = tcu::operator<<(poVar17,(Vector<float,_4> *)local_268);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Color:",7);
                  tcu::operator<<(poVar17,(Vector<float,_4> *)local_250);
                  std::__cxx11::stringbuf::str();
LAB_004877cc:
                  std::__cxx11::string::operator=((string *)&local_288,(string *)local_2a8);
                  if ((long *)CONCAT44(local_2a8[1],local_2a8[0]) != local_298) {
                    operator_delete((long *)CONCAT44(local_2a8[1],local_2a8[0]),local_298[0] + 1);
                  }
                  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
                  std::ios_base::~ios_base(local_2d0);
                }
                break;
              case TEXTURECHANNELCLASS_SIGNED_INTEGER:
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)local_2c8,iVar14,uVar25,local_2e0);
                local_250._0_4_ = pTVar24->order;
                local_250._4_4_ = pTVar24->type;
                local_250._8_4_ = pTVar24[1].order;
                local_250._12_4_ = pTVar24[1].type;
                lVar21 = 0;
                do {
                  (&local_238.order)[lVar21] = A;
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 4);
                local_1b8 = (undefined1  [16])0x0;
                lVar21 = 0;
                do {
                  iVar14 = *(int *)(local_2c8 + lVar21 * 4);
                  iVar13 = *(int *)(local_250 + lVar21 * 4);
                  iVar19 = iVar14 - iVar13;
                  if (iVar14 - iVar13 == 0 || iVar14 < iVar13) {
                    iVar19 = -(iVar14 - iVar13);
                  }
                  *(int *)(local_1b8 + lVar21 * 4) = iVar19;
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 4);
                auVar8._12_4_ = 0;
                auVar8._0_12_ = stack0xfffffffffffffd9c;
                _local_268 = (float  [4])(auVar8 << 0x20);
                lVar21 = 0;
                do {
                  local_268[lVar21] =
                       *(int *)(local_1b8 + lVar21 * 4) <= (int)(&local_238.order)[lVar21];
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 4);
                local_2a8[0] = 0;
                lVar21 = 0;
                do {
                  *(char *)((long)local_2a8 + lVar21) = local_2dc.m_data[lVar21] & local_268[lVar21]
                  ;
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 4);
                lVar21 = 0;
                bVar6 = false;
                do {
                  bVar27 = true;
                  if (!bVar6) {
                    bVar27 = (bool)*(char *)((long)local_2a8 + lVar21) != local_2dc.m_data[lVar21];
                  }
                  lVar21 = lVar21 + 1;
                  bVar6 = bVar27;
                } while (lVar21 != 4);
                bVar27 = (bool)(bVar27 ^ 1);
                if (!bVar27) {
                  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8[0]._M_local_buf,"Ref:",4);
                  poVar17 = tcu::operator<<((ostream *)local_1a8[0]._M_local_buf,
                                            (Vector<int,_4> *)local_250);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Mask:",6);
                  poVar17 = tcu::operator<<(poVar17,&local_2dc);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Threshold:",0xb);
                  poVar17 = tcu::operator<<(poVar17,(Vector<int,_4> *)&local_238);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Color:",7);
                  tcu::operator<<(poVar17,(Vector<int,_4> *)local_2c8);
                  std::__cxx11::stringbuf::str();
                  goto LAB_004877cc;
                }
                break;
              case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)local_2c8,iVar14,uVar25,local_2e0);
                local_250._0_4_ = pTVar24->order;
                local_250._4_4_ = pTVar24->type;
                local_250._8_4_ = pTVar24[1].order;
                local_250._12_4_ = pTVar24[1].type;
                lVar21 = 0;
                do {
                  (&local_238.order)[lVar21] = A;
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 4);
                local_1b8 = (undefined1  [16])0x0;
                lVar21 = 0;
                do {
                  uVar23 = *(uint *)(local_250 + lVar21 * 4);
                  uVar28 = *(uint *)(local_2c8 + lVar21 * 4);
                  iVar14 = uVar23 - uVar28;
                  if (uVar23 < uVar28) {
                    iVar14 = -(uVar23 - uVar28);
                  }
                  *(int *)(local_1b8 + lVar21 * 4) = iVar14;
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 4);
                auVar9._12_4_ = 0;
                auVar9._0_12_ = stack0xfffffffffffffd9c;
                _local_268 = (float  [4])(auVar9 << 0x20);
                lVar21 = 0;
                do {
                  local_268[lVar21] =
                       *(ChannelOrder *)(local_1b8 + lVar21 * 4) <= (&local_238.order)[lVar21];
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 4);
                local_2a8[0] = 0;
                lVar21 = 0;
                do {
                  *(char *)((long)local_2a8 + lVar21) = local_2dc.m_data[lVar21] & local_268[lVar21]
                  ;
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 4);
                lVar21 = 0;
                bVar6 = false;
                do {
                  bVar27 = true;
                  if (!bVar6) {
                    bVar27 = (bool)*(char *)((long)local_2a8 + lVar21) != local_2dc.m_data[lVar21];
                  }
                  lVar21 = lVar21 + 1;
                  bVar6 = bVar27;
                } while (lVar21 != 4);
                bVar27 = (bool)(bVar27 ^ 1);
                if (!bVar27) {
                  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8[0]._M_local_buf,"Ref:",4);
                  poVar17 = tcu::operator<<((ostream *)local_1a8[0]._M_local_buf,
                                            (Vector<unsigned_int,_4> *)local_250);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Mask:",6);
                  poVar17 = tcu::operator<<(poVar17,&local_2dc);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Threshold:",0xb);
                  poVar17 = tcu::operator<<(poVar17,(Vector<unsigned_int,_4> *)&local_238);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar17," Color:",7);
                  tcu::operator<<(poVar17,(Vector<unsigned_int,_4> *)local_2c8);
                  std::__cxx11::stringbuf::str();
                  goto LAB_004877cc;
                }
                break;
              case TEXTURECHANNELCLASS_FLOATING_POINT:
                tcu::ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)local_2c8,iVar14,uVar25,local_2e0);
                local_250._0_8_ = *pTVar24;
                local_250._8_8_ = pTVar24[1];
                tcu::getTextureFormatMantissaBitDepth((tcu *)&local_238,&local_218);
                lVar21 = 0;
                do {
                  local_2a8[lVar21] = 1;
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 4);
                local_1b8 = (undefined1  [16])0x0;
                lVar21 = 0;
                do {
                  *(int *)(local_1b8 + lVar21 * 4) = local_2a8[lVar21] * 10;
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 4);
                local_228._0_4_ = 0.0;
                local_228._4_4_ = 0.0;
                fStack_220 = 0.0;
                fStack_21c = 0.0;
                lVar21 = 0;
                do {
                  *(ChannelOrder *)(local_228 + lVar21 * 4) = 0x17 - (&local_238.order)[lVar21];
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 4);
                local_268._0_4_ = 0.0;
                local_268._4_4_ = 0.0;
                fStack_260 = 0.0;
                fStack_25c = 0.0;
                lVar21 = 0;
                do {
                  *(int *)(local_268 + lVar21 * 4) =
                       *(int *)(local_1b8 + lVar21 * 4) << (local_228[lVar21 * 4] & 0x1f);
                  lVar21 = lVar21 + 1;
                } while (lVar21 != 4);
                local_2d4 = (float)local_268._0_4_;
                uVar15 = 0;
                bVar27 = false;
                do {
                  uVar23 = *(uint *)(local_2c8 + uVar15 * 4) & 0x7fffffff;
                  uVar28 = *(uint *)(local_250 + uVar15 * 4) & 0x7fffffff;
                  iVar14 = uVar23 - uVar28;
                  if (uVar23 < uVar28) {
                    iVar14 = -(uVar23 - uVar28);
                  }
                  bVar22 = 1;
                  if (*(int *)(local_268 + uVar15 * 4) < iVar14) {
                    bVar22 = local_2dc.m_data[uVar15] ^ 1;
                  }
                  if (bVar22 == 0) {
                    local_228._4_4_ = local_268._0_4_;
                    local_228._0_4_ = local_268._0_4_;
                    fStack_220 = (float)local_268._0_4_;
                    fStack_21c = (float)local_268._0_4_;
                    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8[0]._M_local_buf,"Ref:",4);
                    poVar17 = tcu::operator<<((ostream *)local_1a8[0]._M_local_buf,
                                              (Vector<float,_4> *)local_250);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar17," Mask:",6);
                    poVar17 = tcu::operator<<(poVar17,&local_2dc);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar17," Threshold:",0xb);
                    poVar17 = tcu::operator<<(poVar17,(Vector<float,_4> *)local_228);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar17," Color:",7);
                    tcu::operator<<(poVar17,(Vector<float,_4> *)local_2c8);
                    std::__cxx11::stringbuf::str();
                    std::__cxx11::string::operator=((string *)&local_288,(string *)local_2a8);
                    if ((long *)CONCAT44(local_2a8[1],local_2a8[0]) != local_298) {
                      operator_delete((long *)CONCAT44(local_2a8[1],local_2a8[0]),local_298[0] + 1);
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
                    std::ios_base::~ios_base(local_2d0);
                    break;
                  }
                  bVar27 = 2 < uVar15;
                  uVar15 = uVar15 + 1;
                } while (uVar15 != 4);
              }
              if (!bVar27) goto LAB_0048784c;
              uVar25 = uVar25 + 1;
              bVar22 = uVar25 < (uint)local_1d8;
              this = local_2b0;
            } while (uVar25 != local_20c);
            iVar13 = 0x17;
            iVar14 = (int)local_208;
LAB_004878dd:
            if ((bVar22 & 1) != 0) goto LAB_004878fd;
            local_2e0 = local_2e0 + 1;
          } while (local_2e0 != (uint)local_1e8);
          iVar13 = 0x14;
LAB_004878fd:
          if (iVar13 != 0x14) goto LAB_0048791e;
          local_2d8 = local_2d8 + 1;
        } while (local_2d8 != local_210);
        iVar13 = 0x11;
LAB_0048791e:
        if (iVar13 != 0x11) goto LAB_00487934;
        uVar15 = (ulong)(iVar14 + 1U);
      } while (iVar14 + 1U < this->m_imageMipLevels);
    }
    iVar13 = 0xe;
LAB_00487934:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,
                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                               local_288.field_2._M_local_buf[0]) + 1);
    }
    de::details::UniqueBase<tcu::TextureLevelPyramid,_de::DefaultDeleter<tcu::TextureLevelPyramid>_>
    ::reset(&local_1c8);
    if ((iVar13 != 0xe) && (iVar13 != 0)) {
      return local_240;
    }
  }
  local_240->m_code = QP_TEST_RESULT_PASS;
  (local_240->m_description)._M_dataplus._M_p = (pointer)&(local_240->m_description).field_2;
  pcVar3 = (local_200->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_240->m_description,pcVar3,pcVar3 + local_200->_M_string_length);
  return local_240;
}

Assistant:

tcu::TestStatus ImageClearingTestInstance::verifyResultImage (const std::string& successMessage, const UVec4& clearCoords) const
{
	const bool useClearRange = clearCoords != UVec4();
	DE_ASSERT(!useClearRange || m_params.imageExtent.depth == 1u);

	if (getIsDepthFormat(m_params.imageFormat))
	{
		DE_ASSERT(m_imageMipLevels == 1u);

		de::MovePtr<TextureLevelPyramid>	image			= readImage(VK_IMAGE_ASPECT_DEPTH_BIT);
		std::string							message;
		float								depthValue;

		for (deUint32 y = 0; y < m_params.imageExtent.height; ++y)
		for (deUint32 x = 0; x < m_params.imageExtent.width; ++x)
		{
			if (!useClearRange || isInClearRange(clearCoords, x, y))
				depthValue = m_params.clearValue[0].depthStencil.depth;
			else
				depthValue = m_params.initValue.depthStencil.depth;

			if (!comparePixelToDepthClearValue(image->getLevel(0), x, y, depthValue, message))
				return TestStatus::fail("Depth value mismatch! " + message);
		}
	}

	if (getIsStencilFormat(m_params.imageFormat))
	{
		DE_ASSERT(m_imageMipLevels == 1u);

		de::MovePtr<TextureLevelPyramid>	image			= readImage(VK_IMAGE_ASPECT_STENCIL_BIT);
		std::string							message;
		deUint32							stencilValue;

		for (deUint32 y = 0; y < m_params.imageExtent.height; ++y)
		for (deUint32 x = 0; x < m_params.imageExtent.width; ++x)
		{
			if (!useClearRange || isInClearRange(clearCoords, x, y))
				stencilValue = m_params.clearValue[0].depthStencil.stencil;
			else
				stencilValue = m_params.initValue.depthStencil.stencil;

			if (!comparePixelToStencilClearValue(image->getLevel(0), x, y, stencilValue, message))
				return TestStatus::fail("Stencil value mismatch! " + message);
		}
	}

	if (!isDepthStencilFormat(m_params.imageFormat))
	{
		de::MovePtr<TextureLevelPyramid>	image			= readImage(VK_IMAGE_ASPECT_COLOR_BIT);
		std::string							message;
		const VkClearColorValue*			pColorValue;

		for (deUint32 mipLevel = 0; mipLevel < m_imageMipLevels; ++mipLevel)
		{
			const int			clearColorNdx	= (mipLevel < m_thresholdMipLevel ? 0 : 1);
			const VkExtent3D	extent			= getMipLevelExtent(m_params.imageExtent, mipLevel);

			for (deUint32 z = 0; z < extent.depth;  ++z)
			for (deUint32 y = 0; y < extent.height; ++y)
			for (deUint32 x = 0; x < extent.width;  ++x)
			{
				if (!useClearRange || isInClearRange(clearCoords, x, y))
					pColorValue = &m_params.clearValue[clearColorNdx].color;
				else
					pColorValue = &m_params.initValue.color;

				if (!comparePixelToColorClearValue(image->getLevel(mipLevel), x, y, z, *pColorValue, message))
					return TestStatus::fail("Color value mismatch! " + message);
			}
		}
	}

	return TestStatus::pass(successMessage);
}